

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_variables.c
# Opt level: O2

ngx_stream_regex_t * ngx_stream_regex_compile(ngx_conf_t *cf,ngx_regex_compile_t *rc)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ngx_int_t nVar4;
  ngx_stream_regex_t *pnVar5;
  ulong uVar6;
  ngx_stream_regex_variable_t *pnVar7;
  ngx_stream_variable_t *pnVar8;
  ngx_int_t *pnVar9;
  u_char *puVar10;
  u_char *__s;
  bool bVar11;
  undefined1 local_58 [8];
  ngx_str_t name;
  
  rc->pool = cf->pool;
  nVar4 = ngx_regex_compile(rc);
  if (nVar4 != 0) {
    ngx_conf_log_error(1,cf,0,"%V",&rc->err);
    return (ngx_stream_regex_t *)0x0;
  }
  pnVar5 = (ngx_stream_regex_t *)ngx_pcalloc(cf->pool,0x30);
  if (pnVar5 != (ngx_stream_regex_t *)0x0) {
    pnVar5->regex = rc->regex;
    uVar6 = (ulong)rc->captures;
    pnVar5->ncaptures = uVar6;
    puVar10 = (rc->pattern).data;
    (pnVar5->name).len = (rc->pattern).len;
    (pnVar5->name).data = puVar10;
    lVar2 = *(long *)(*cf->ctx + ngx_stream_core_module.ctx_index * 8);
    uVar3 = *(ulong *)(lVar2 + 0xb8);
    if (uVar6 < uVar3) {
      uVar6 = uVar3;
    }
    *(ulong *)(lVar2 + 0xb8) = uVar6;
    puVar10 = (u_char *)(long)rc->named_captures;
    if (puVar10 == (u_char *)0x0) {
      return pnVar5;
    }
    pnVar7 = (ngx_stream_regex_variable_t *)ngx_palloc(rc->pool,(long)puVar10 << 4);
    if (pnVar7 != (ngx_stream_regex_variable_t *)0x0) {
      pnVar5->variables = pnVar7;
      pnVar5->nvariables = (ngx_uint_t)puVar10;
      iVar1 = rc->name_size;
      pnVar9 = &pnVar7->index;
      __s = rc->names + 2;
      name.data = puVar10;
      while( true ) {
        bVar11 = name.data == (u_char *)0x0;
        name.data = name.data + -1;
        if (bVar11) {
          return pnVar5;
        }
        ((ngx_stream_regex_variable_t *)(pnVar9 + -1))->capture =
             (ulong)((uint)__s[-2] * 0x200 + (uint)__s[-1] * 2);
        name.len = (size_t)__s;
        local_58 = (undefined1  [8])strlen((char *)__s);
        pnVar8 = ngx_stream_add_variable(cf,(ngx_str_t *)local_58,1);
        if (pnVar8 == (ngx_stream_variable_t *)0x0) break;
        nVar4 = ngx_stream_get_variable_index(cf,(ngx_str_t *)local_58);
        *pnVar9 = nVar4;
        if (nVar4 == -1) {
          return (ngx_stream_regex_t *)0x0;
        }
        pnVar8->get_handler = ngx_stream_variable_not_found;
        pnVar9 = pnVar9 + 2;
        __s = __s + iVar1;
      }
    }
  }
  return (ngx_stream_regex_t *)0x0;
}

Assistant:

ngx_stream_regex_t *
ngx_stream_regex_compile(ngx_conf_t *cf, ngx_regex_compile_t *rc)
{
    u_char                       *p;
    size_t                        size;
    ngx_str_t                     name;
    ngx_uint_t                    i, n;
    ngx_stream_variable_t        *v;
    ngx_stream_regex_t           *re;
    ngx_stream_regex_variable_t  *rv;
    ngx_stream_core_main_conf_t  *cmcf;

    rc->pool = cf->pool;

    if (ngx_regex_compile(rc) != NGX_OK) {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0, "%V", &rc->err);
        return NULL;
    }

    re = ngx_pcalloc(cf->pool, sizeof(ngx_stream_regex_t));
    if (re == NULL) {
        return NULL;
    }

    re->regex = rc->regex;
    re->ncaptures = rc->captures;
    re->name = rc->pattern;

    cmcf = ngx_stream_conf_get_module_main_conf(cf, ngx_stream_core_module);
    cmcf->ncaptures = ngx_max(cmcf->ncaptures, re->ncaptures);

    n = (ngx_uint_t) rc->named_captures;

    if (n == 0) {
        return re;
    }

    rv = ngx_palloc(rc->pool, n * sizeof(ngx_stream_regex_variable_t));
    if (rv == NULL) {
        return NULL;
    }

    re->variables = rv;
    re->nvariables = n;

    size = rc->name_size;
    p = rc->names;

    for (i = 0; i < n; i++) {
        rv[i].capture = 2 * ((p[0] << 8) + p[1]);

        name.data = &p[2];
        name.len = ngx_strlen(name.data);

        v = ngx_stream_add_variable(cf, &name, NGX_STREAM_VAR_CHANGEABLE);
        if (v == NULL) {
            return NULL;
        }

        rv[i].index = ngx_stream_get_variable_index(cf, &name);
        if (rv[i].index == NGX_ERROR) {
            return NULL;
        }

        v->get_handler = ngx_stream_variable_not_found;

        p += size;
    }

    return re;
}